

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetPrivate::emitItemActivated(QTreeWidgetPrivate *this,QModelIndex *index)

{
  QTreeWidget *this_00;
  QTreeWidgetItem *_t1;
  
  this_00 = *(QTreeWidget **)
             &(this->super_QTreeViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  _t1 = item(this,index);
  QTreeWidget::itemActivated(this_00,_t1,index->c);
  return;
}

Assistant:

void QTreeWidgetPrivate::emitItemActivated(const QModelIndex &index)
{
    Q_Q(QTreeWidget);
    emit q->itemActivated(item(index), index.column());
}